

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.h
# Opt level: O0

RootTable * flatbuffers::GetMutableRoot<v1::RootTable>(void *buf)

{
  uint uVar1;
  void *buf_local;
  
  if (buf == (void *)0x0) {
    buf_local = (void *)0x0;
  }
  else {
    EndianCheck();
    uVar1 = EndianScalar<unsigned_int>(*buf);
    buf_local = (void *)((long)buf + (ulong)uVar1);
  }
  return (RootTable *)buf_local;
}

Assistant:

T *GetMutableRoot(void *buf) {
  if (!buf) return nullptr;
  EndianCheck();
  return reinterpret_cast<T *>(
      reinterpret_cast<uint8_t *>(buf) +
      EndianScalar(*reinterpret_cast<uoffset_t *>(buf)));
}